

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::ConvertTo8Bit
               (Image16Bit *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  unsigned_short *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_short> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint16_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint16_t *inY;
  uint8_t colorCount;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  unsigned_short *puVar11;
  ImageTemplate<unsigned_short> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_short>>
            (in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,
             (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa0);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)in_stack_ffffffffffffffb0,
             (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,
             (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_short>::colorCount(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RCX);
  if (uVar1 != uVar2) {
    uVar6 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar6,&imageException::typeinfo,imageException::~imageException);
  }
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_short>::rowSize(in_RDI);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  bVar3 = PenguinV_Image::ImageTemplate<unsigned_short>::colorCount(in_RDI);
  puVar7 = PenguinV_Image::ImageTemplate<unsigned_short>::data(in_RDI);
  puVar7 = puVar7 + (ulong)(in_EDX * uVar4) + (ulong)in_ESI;
  puVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar8 = puVar8 + (ulong)(in_R8D * (uint)bVar3) + (ulong)(in_R9D * uVar5);
  puVar9 = puVar8 + (int)outXEnd * uVar5;
  for (; puVar8 != puVar9; puVar8 = puVar8 + uVar5) {
    puVar11 = puVar7;
    for (puVar10 = puVar8; puVar10 != puVar8 + in_stack_00000008 * (uint)bVar3;
        puVar10 = puVar10 + 1) {
      *puVar10 = (uchar)(*puVar11 >> 8);
      puVar11 = puVar11 + 1;
    }
    puVar7 = puVar7 + uVar4;
  }
  return;
}

Assistant:

void ConvertTo8Bit( const Image16Bit & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                        uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, width, height );
        if ( in.colorCount() != out.colorCount() )
            throw imageException( "Color counts of images are different" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint16_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t      * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint16_t * inX  = inY;
            uint8_t        * outX = outY;
            const uint8_t  * outXEnd = outX + width;

            for ( ; outX != outXEnd; ++outX, ++inX )
                *outX = (*inX) >> 8;
        }
    }